

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

type_equivalence typeEquivalence(UA_DataType *t)

{
  UA_DataType *t_local;
  
  if ((t->membersSize == '\x01') && ((t->members->field_0xb & 1) != 0)) {
    if (t->members->memberTypeIndex == 5) {
      t_local._4_4_ = TYPE_EQUIVALENCE_ENUM;
    }
    else if ((t->members->memberTypeIndex == 2) && (((byte)t->members->field_0xb >> 1 & 1) != 0)) {
      t_local._4_4_ = TYPE_EQUIVALENCE_OPAQUE;
    }
    else {
      t_local._4_4_ = TYPE_EQUIVALENCE_NONE;
    }
  }
  else {
    t_local._4_4_ = TYPE_EQUIVALENCE_NONE;
  }
  return t_local._4_4_;
}

Assistant:

static enum type_equivalence
typeEquivalence(const UA_DataType *t) {
    if(t->membersSize != 1 || !t->members[0].namespaceZero)
        return TYPE_EQUIVALENCE_NONE;
    if(t->members[0].memberTypeIndex == UA_TYPES_INT32)
        return TYPE_EQUIVALENCE_ENUM;
    if(t->members[0].memberTypeIndex == UA_TYPES_BYTE && t->members[0].isArray)
        return TYPE_EQUIVALENCE_OPAQUE;
    return TYPE_EQUIVALENCE_NONE;
}